

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

void Dtc_ManPrintFadds(Vec_Int_t *vFadds)

{
  uint uVar1;
  int i;
  uint uVar2;
  
  i = 4;
  uVar2 = 0;
  while( true ) {
    if (vFadds->nSize / 5 <= (int)uVar2) break;
    printf("%6d : ",(ulong)uVar2,(long)vFadds->nSize % 5 & 0xffffffff);
    uVar1 = Vec_IntEntry(vFadds,i + -4);
    printf("%6d ",(ulong)uVar1);
    uVar1 = Vec_IntEntry(vFadds,i + -3);
    printf("%6d ",(ulong)uVar1);
    uVar1 = Vec_IntEntry(vFadds,i + -2);
    printf("%6d ",(ulong)uVar1);
    printf(" ->  ");
    uVar1 = Vec_IntEntry(vFadds,i + -1);
    printf("%6d ",(ulong)uVar1);
    uVar1 = Vec_IntEntry(vFadds,i);
    printf("%6d ",(ulong)uVar1);
    putchar(10);
    uVar2 = uVar2 + 1;
    i = i + 5;
  }
  return;
}

Assistant:

void Dtc_ManPrintFadds( Vec_Int_t * vFadds )
{
    int i;
    Dtc_ForEachFadd( vFadds, i )
    {
        printf( "%6d : ", i );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+0) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+1) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+2) );
        printf( " ->  " );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+3) );
        printf( "%6d ", Vec_IntEntry(vFadds, 5*i+4) );
        printf( "\n" );
    }
}